

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

void __thiscall
ParamListStandardOut::assignMap
          (ParamListStandardOut *this,vector<Datatype_*,_std::allocator<Datatype_*>_> *proto,
          bool isinput,TypeFactory *typefactory,
          vector<ParameterPieces,_std::allocator<ParameterPieces>_> *res)

{
  int iVar1;
  value_type pDVar2;
  undefined8 uVar3;
  uint4 s;
  pointer piVar4;
  bool bVar5;
  type_metatype tVar6;
  const_reference ppDVar7;
  reference pvVar8;
  Architecture *this_00;
  ParamUnassignedError *this_01;
  ParameterPieces local_118;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  undefined1 local_c8 [24];
  Datatype *pointertp;
  int4 wordsize;
  int4 pointersize;
  AddrSpace *spc;
  undefined4 local_8c;
  ParameterPieces local_88;
  allocator<int> local_4d;
  value_type_conflict1 local_4c;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> status;
  vector<ParameterPieces,_std::allocator<ParameterPieces>_> *res_local;
  TypeFactory *typefactory_local;
  bool isinput_local;
  vector<Datatype_*,_std::allocator<Datatype_*>_> *proto_local;
  ParamListStandardOut *this_local;
  
  iVar1 = (this->super_ParamListStandard).numgroup;
  local_4c = 0;
  status.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)res;
  std::allocator<int>::allocator(&local_4d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,(long)iVar1,&local_4c,&local_4d);
  std::allocator<int>::~allocator(&local_4d);
  piVar4 = status.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  local_88.type = (Datatype *)0x0;
  local_88._24_8_ = 0;
  local_88.addr.base = (AddrSpace *)0x0;
  local_88.addr.offset = 0;
  ParameterPieces::ParameterPieces(&local_88);
  std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::push_back
            ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)piVar4,&local_88);
  ppDVar7 = std::vector<Datatype_*,_std::allocator<Datatype_*>_>::operator[](proto,0);
  pDVar2 = *ppDVar7;
  pvVar8 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                     ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                      status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  pvVar8->type = pDVar2;
  pvVar8 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                     ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                      status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  pvVar8->flags = 0;
  ppDVar7 = std::vector<Datatype_*,_std::allocator<Datatype_*>_>::operator[](proto,0);
  tVar6 = Datatype::getMetatype(*ppDVar7);
  if (tVar6 == TYPE_VOID) {
    local_8c._0_1_ = true;
    local_8c._1_3_ = 0;
  }
  else {
    ppDVar7 = std::vector<Datatype_*,_std::allocator<Datatype_*>_>::operator[](proto,0);
    ParamListStandard::assignAddress
              ((ParamListStandard *)&spc,(Datatype *)this,
               (vector<int,_std::allocator<int>_> *)*ppDVar7);
    pvVar8 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                       ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                        status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    Address::operator=(&pvVar8->addr,(Address *)&spc);
    pvVar8 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                       ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                        status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    bVar5 = Address::isInvalid(&pvVar8->addr);
    if (bVar5) {
      _wordsize = (this->super_ParamListStandard).spacebase;
      if (_wordsize == (AddrSpace *)0x0) {
        this_00 = TypeFactory::getArch(typefactory);
        _wordsize = AddrSpaceManager::getDefaultSpace(&this_00->super_AddrSpaceManager);
      }
      pointertp._4_4_ = AddrSpace::getAddrSize(_wordsize);
      pointertp._0_4_ = AddrSpace::getWordSize(_wordsize);
      s = pointertp._4_4_;
      ppDVar7 = std::vector<Datatype_*,_std::allocator<Datatype_*>_>::operator[](proto,0);
      local_c8._16_8_ = TypeFactory::getTypePointerAbsolute(typefactory,s,*ppDVar7,(uint4)pointertp)
      ;
      ParamListStandard::assignAddress
                ((ParamListStandard *)local_c8,(Datatype *)this,
                 (vector<int,_std::allocator<int>_> *)local_c8._16_8_);
      pvVar8 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      Address::operator=(&pvVar8->addr,(Address *)local_c8);
      pvVar8 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      bVar5 = Address::isInvalid(&pvVar8->addr);
      uVar3 = local_c8._16_8_;
      if (bVar5) {
        local_ea = 1;
        this_01 = (ParamUnassignedError *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e8,"Cannot assign return value as a pointer",&local_e9);
        ParamUnassignedError::ParamUnassignedError(this_01,(string *)local_e8);
        local_ea = 0;
        __cxa_throw(this_01,&ParamUnassignedError::typeinfo,
                    ParamUnassignedError::~ParamUnassignedError);
      }
      pvVar8 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      pvVar8->type = (Datatype *)uVar3;
      pvVar8 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      piVar4 = status.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      pvVar8->flags = 0x10000000;
      local_118.type = (Datatype *)0x0;
      local_118.flags = 0;
      local_118._28_4_ = 0;
      local_118.addr.base = (AddrSpace *)0x0;
      local_118.addr.offset = 0;
      ParameterPieces::ParameterPieces(&local_118);
      std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::push_back
                ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)piVar4,&local_118);
      uVar3 = local_c8._16_8_;
      pvVar8 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      pvVar8->type = (Datatype *)uVar3;
      pvVar8 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      pvVar8->flags = 0x20000000;
    }
    local_8c._0_1_ = false;
    local_8c._1_3_ = 0;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  return;
}

Assistant:

void ParamListStandardOut::assignMap(const vector<Datatype *> &proto,bool isinput,
				     TypeFactory &typefactory,vector<ParameterPieces> &res) const
{
  vector<int4> status(numgroup,0);

  // This is always an output list so we ignore -isinput-
  res.push_back(ParameterPieces());
  res.back().type = proto[0];
  res.back().flags = 0;
  if (proto[0]->getMetatype() == TYPE_VOID) {
    return;			// Leave the address as invalid
  }
  res.back().addr = assignAddress(proto[0],status);
  if (res.back().addr.isInvalid()) { // Could not assign an address (too big)
    AddrSpace *spc = spacebase;
    if (spc == (AddrSpace *)0)
      spc = typefactory.getArch()->getDefaultSpace();
    int4 pointersize = spc->getAddrSize();
    int4 wordsize = spc->getWordSize();
    Datatype *pointertp = typefactory.getTypePointerAbsolute(pointersize, proto[0], wordsize);
    res.back().addr = assignAddress(pointertp,status);
    if (res.back().addr.isInvalid())
      throw ParamUnassignedError("Cannot assign return value as a pointer");
    res.back().type = pointertp;
    res.back().flags = Varnode::indirectstorage;

    res.push_back(ParameterPieces()); // Add extra storage location in the input params
    res.back().type = pointertp;      // that holds a pointer to where the return value should be stored
    // leave its address invalid, to be filled in by the input list assignMap
    res.back().flags = Varnode::hiddenretparm; // Mark it as special 
  }
}